

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O3

double GetExecutorResultDouble(uint tempStackType,uint *tempStackArrayBase)

{
  if ((tempStackType & 0xfffffffe) == 6) {
    return *(double *)tempStackArrayBase;
  }
  __assert_fail("!\"return type is not \'double\'\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Executor_Common.cpp"
                ,0x6e6,"double GetExecutorResultDouble(unsigned int, unsigned int *)");
}

Assistant:

double GetExecutorResultDouble(unsigned tempStackType, unsigned *tempStackArrayBase)
{
	double value = 0.0;

	switch(tempStackType)
	{
	case NULLC_TYPE_FLOAT:
	case NULLC_TYPE_DOUBLE:
		memcpy(&value, tempStackArrayBase, sizeof(value));
		return value;
	default:
		assert(!"return type is not 'double'");
		break;
	}

	return value;
}